

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

PolyNode * __thiscall ClipperLib::PolyNode::GetNextSiblingUp(PolyNode *this)

{
  uint uVar1;
  size_type sVar2;
  reference ppPVar3;
  PolyNode *this_local;
  
  if (this->Parent == (PolyNode *)0x0) {
    this_local = (PolyNode *)0x0;
  }
  else {
    uVar1 = this->Index;
    sVar2 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::size
                      (&this->Parent->Childs);
    if ((ulong)uVar1 == sVar2 - 1) {
      this_local = GetNextSiblingUp(this->Parent);
    }
    else {
      ppPVar3 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
                operator[](&this->Parent->Childs,(ulong)(this->Index + 1));
      this_local = *ppPVar3;
    }
  }
  return this_local;
}

Assistant:

PolyNode* PolyNode::GetNextSiblingUp() const
{ 
  if (!Parent) //protects against PolyTree.GetNextSiblingUp()
      return 0;
  else if (Index == Parent->Childs.size() - 1)
      return Parent->GetNextSiblingUp();
  else
      return Parent->Childs[Index + 1];
}